

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_BrepTrim::Reverse(ON_BrepTrim *this)

{
  ON_Interval domain;
  bool bVar1;
  int iVar2;
  ON_Curve *this_00;
  ON_Curve *extraout_XMM0_Qa;
  double in_XMM1_Qa;
  int i;
  ON_Curve *c2;
  ON_Interval trim_domain;
  bool rc;
  ON_BrepTrim *this_local;
  
  ON_SimpleArray<ON_BrepTrimPoint>::Destroy(&this->m_pline);
  ON_Curve::DestroyCurveTree((ON_Curve *)this);
  trim_domain.m_t[1]._7_1_ = 0;
  if (this->m_brep != (ON_Brep *)0x0) {
    (*(this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x25])();
    c2 = extraout_XMM0_Qa;
    trim_domain.m_t[0] = in_XMM1_Qa;
    bVar1 = ON_Brep::StandardizeTrimCurve(this->m_brep,this->m_trim_index);
    if ((bVar1) && (this_00 = TrimCurveOf(this), this_00 != (ON_Curve *)0x0)) {
      iVar2 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])();
      trim_domain.m_t[1]._7_1_ = (byte)iVar2 & 1;
      ON_Interval::Reverse((ON_Interval *)&c2);
      domain.m_t[1] = trim_domain.m_t[0];
      domain.m_t[0] = (double)c2;
      ON_Curve::SetDomain(this_00,domain);
      ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,this_00);
    }
  }
  if ((trim_domain.m_t[1]._7_1_ & 1) == 0) {
    trim_domain.m_t[1]._7_1_ = ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
  }
  if ((trim_domain.m_t[1]._7_1_ & 1) != 0) {
    iVar2 = this->m_vi[0];
    this->m_vi[0] = this->m_vi[1];
    this->m_vi[1] = iVar2;
    if (-1 < this->m_ei) {
      this->m_bRev3d = (bool)((this->m_bRev3d & 1U) - 1 & 1);
    }
  }
  return (bool)(trim_domain.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_BrepTrim::Reverse()
{
  m_pline.Destroy();
  DestroyCurveTree();

  bool rc = false;
  if ( m_brep )
  {
    ON_Interval trim_domain = Domain();
    if ( m_brep->StandardizeTrimCurve( m_trim_index ) )
    {
      ON_Curve* c2 = const_cast<ON_Curve*>(TrimCurveOf());
      if ( c2 )
      {
        rc = c2->Reverse();
        trim_domain.Reverse();
        c2->SetDomain(trim_domain);
        SetProxyCurve(c2);
      }
    }
  }

  if ( !rc )
    rc = ON_CurveProxy::Reverse();

  if (rc)
  {
    int i = m_vi[0];
    m_vi[0] = m_vi[1];
    m_vi[1] = i;
    if ( m_ei >= 0 )
      m_bRev3d = m_bRev3d ? false : true;
  }
  return rc;
}